

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

double __thiscall chrono::fea::ChElementShellBST::GetDensity(ChElementShellBST *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pLVar4;
  pointer pLVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  
  pLVar4 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar5 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auVar10 = ZEXT864(0) << 0x40;
  dVar8 = 0.0;
  if (pLVar5 != pLVar4) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      auVar9 = auVar10._0_16_;
      lVar3 = *(long *)((long)&(pLVar4->m_material).
                               super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar7);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(pLVar4->m_material).
                         super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + lVar7);
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        uVar1 = *(ulong *)(lVar3 + 0x38);
      }
      else {
        auVar9._0_8_ = auVar10._0_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        uVar1 = *(ulong *)(lVar3 + 0x38);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        auVar9._8_8_ = 0;
        pLVar4 = (this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar5 = (this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)&pLVar4->m_thickness + lVar7);
      auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar2);
      auVar10 = ZEXT1664(auVar9);
      dVar8 = auVar9._0_8_;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x28;
    } while (uVar6 < (ulong)(((long)pLVar5 - (long)pLVar4 >> 3) * -0x3333333333333333));
  }
  return dVar8 / this->tot_thickness;
}

Assistant:

double ChElementShellBST::GetDensity() {
    double tot_density = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
		double rho = m_layers[kl].GetMaterial()->GetDensity();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / tot_thickness;
}